

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::RegistrarForTagAliases::RegistrarForTagAliases
          (RegistrarForTagAliases *this,char *alias,char *tag,SourceLineInfo *lineInfo)

{
  IMutableRegistryHub *pIVar1;
  allocator local_62;
  allocator local_61;
  string local_60 [32];
  string local_40 [32];
  
  pIVar1 = getMutableRegistryHub();
  std::__cxx11::string::string(local_40,alias,&local_61);
  std::__cxx11::string::string(local_60,tag,&local_62);
  (*pIVar1->_vptr_IMutableRegistryHub[6])(pIVar1,local_40,local_60,lineInfo);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

RegistrarForTagAliases::RegistrarForTagAliases( char const* alias, char const* tag, SourceLineInfo const& lineInfo ) {
        getMutableRegistryHub().registerTagAlias( alias, tag, lineInfo );
    }